

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

StatusRep * absl::Status::PrepareToModify(uintptr_t rep)

{
  StatusRep *pSVar1;
  _Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
  local_18;
  
  if ((rep & 1) == 0) {
    pSVar1 = status_internal::StatusRep::CloneAndUnref((StatusRep *)rep);
    return pSVar1;
  }
  pSVar1 = (StatusRep *)operator_new(0x30);
  local_18._M_head_impl =
       (InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
        *)0x0;
  (pSVar1->ref_).super___atomic_base<int>._M_i = 1;
  pSVar1->code_ = (StatusCode)(rep >> 2);
  (pSVar1->message_)._M_dataplus._M_p = (pointer)&(pSVar1->message_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pSVar1->message_,0,0);
  (pSVar1->payloads_)._M_t.
  super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
  .
  super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
  ._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl =
       (InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
        *)0x0;
  std::
  unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
  ::~unique_ptr((unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                 *)&local_18);
  return pSVar1;
}

Assistant:

status_internal::StatusRep* absl_nonnull Status::PrepareToModify(
    uintptr_t rep) {
  if (IsInlined(rep)) {
    return new status_internal::StatusRep(InlinedRepToCode(rep),
                                          absl::string_view(), nullptr);
  }
  return RepToPointer(rep)->CloneAndUnref();
}